

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute.cpp
# Opt level: O1

int match(State *initial,P_Sequence *p,bool allpaths)

{
  P_Sequence *pPVar1;
  pointer ppPVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  int unaff_EBP;
  int iVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  vector<StateP,_std::allocator<StateP>_> stk;
  vector<StateP,_std::allocator<StateP>_> local_108;
  State local_f0;
  StateP local_98;
  
  local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Grid::Grid(&local_f0.cg,&initial->cg);
  local_f0.flags = initial->flags;
  local_f0.direction = initial->direction;
  local_f0.position = initial->position;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0.qcount,&initial->qcount);
  StateP::StateP(&local_98,&local_f0,p,0);
  std::vector<StateP,_std::allocator<StateP>_>::emplace_back<StateP>(&local_108,&local_98);
  if (local_98.st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Grid::~Grid((Grid *)&local_98);
  if (local_f0.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Grid::~Grid(&local_f0.cg);
  iVar8 = 0;
  do {
    iVar6 = iVar8;
    if (local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    uVar7 = (ulong)local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].iseq;
    pPVar1 = local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].seq;
    ppPVar2 = (pPVar1->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar5 = (long)(pPVar1->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3;
    iVar6 = unaff_EBP;
    if (uVar5 == uVar7) {
      local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1].iseq = pPVar1->iparent + 1;
      local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1].seq = pPVar1->parent;
      bVar9 = true;
    }
    else {
      if (uVar5 <= uVar7) {
        uVar4 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
        StateP::~StateP(&local_98);
        State::~State(&local_f0);
        std::vector<StateP,_std::allocator<StateP>_>::~vector(&local_108);
        _Unwind_Resume(uVar4);
      }
      iVar3 = Pattern_match(ppPVar2[uVar7],&local_108);
      if (iVar3 == 1) {
        if (!allpaths) {
          bVar9 = false;
          iVar6 = 1;
          goto LAB_0010d3f3;
        }
        iVar8 = iVar8 + 1;
        std::vector<StateP,_std::allocator<StateP>_>::pop_back(&local_108);
      }
      bVar9 = (ulong)(((long)local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_108.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) < 100000;
      if (!bVar9) {
        iVar6 = -1;
      }
    }
LAB_0010d3f3:
    unaff_EBP = iVar6;
  } while (bVar9);
  std::vector<StateP,_std::allocator<StateP>_>::~vector(&local_108);
  return iVar6;
}

Assistant:

int match(State initial, P_Sequence *p, bool allpaths) {
    int nmatch = 0;
    vector<StateP> stk;
    stk.push_back(StateP{ initial, p, 0 });
    while (!stk.empty()) {
        auto &bk = stk.back();
        if (bk.iseq == bk.seq->v.size()) {
            bk.iseq = bk.seq->iparent + 1;
            bk.seq = bk.seq->parent;
        } else {
            if (Pattern_match(bk.seq->v.at(bk.iseq), stk) == 1) {
                if (!allpaths) return 1;
                nmatch++;
                stk.pop_back();
            }
            if (stk.size() > MAX_PATTERN_STACK) {
                return MATCH_RESULT_OVERFLOW;
            }
        }
    }
    return nmatch;
}